

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O0

DebuggerScope * __thiscall
ByteCodeGenerator::RecordStartScopeObject
          (ByteCodeGenerator *this,ParseNode *pnode,DiagExtraScopesType scopeType,
          RegSlot scopeLocation,int *index)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  ParseNodeBlock *this_00;
  ByteCodeWriter *this_01;
  DebuggerScope *pDVar4;
  int *index_local;
  RegSlot scopeLocation_local;
  DiagExtraScopesType scopeType_local;
  ParseNode *pnode_local;
  ByteCodeGenerator *this_local;
  
  if (pnode == (ParseNode *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x2db,"(pnode)","pnode");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if (pnode->nop == knopBlock) {
    this_00 = ParseNode::AsParseNodeBlock(pnode);
    bVar2 = ParseNodeBlock::HasBlockScopedContent(this_00);
    if (!bVar2) {
      return (DebuggerScope *)0x0;
    }
  }
  this_01 = Writer(this);
  pDVar4 = Js::ByteCodeWriter::RecordStartScopeObject(this_01,scopeType,scopeLocation,index);
  return pDVar4;
}

Assistant:

Js::DebuggerScope* ByteCodeGenerator::RecordStartScopeObject(ParseNode * pnode, Js::DiagExtraScopesType scopeType, Js::RegSlot scopeLocation /*= Js::Constants::NoRegister*/, int* index /*= nullptr*/)
{
    Assert(pnode);
    if (pnode->nop == knopBlock && !pnode->AsParseNodeBlock()->HasBlockScopedContent())
    {
        // In order to reduce allocations now that we track debugger scopes in non-debug mode,
        // don't add a block to the chain if it has no let/const variables at all.
        return nullptr;
    }

    return this->Writer()->RecordStartScopeObject(scopeType, scopeLocation, index);
}